

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.h
# Opt level: O0

uint64_t sum_quotients<short,libdivide::divider<short,(libdivide::Branching)1>>
                   (random_numerators<short> *vals,divider<short,_(libdivide::Branching)1> *div)

{
  byte bVar1;
  ushort uVar2;
  short sVar3;
  random_numerators<short> *prVar4;
  short *in_RSI;
  random_numerators<short> *in_RDI;
  const_iterator iter;
  UIntT sum;
  uint16_t q_sign;
  uint16_t is_power_of_2;
  int16_t q;
  int16_t magic;
  int16_t sign;
  uint8_t shift;
  uint8_t more;
  int32_t rl;
  int32_t yl;
  int32_t xl;
  random_numerators<short> *prVar5;
  random_numerators<short> *local_78;
  ushort local_6a;
  
  local_6a = 0;
  local_78 = (random_numerators<short> *)random_numerators<short>::begin(in_RDI);
  while( true ) {
    prVar5 = local_78;
    prVar4 = (random_numerators<short> *)random_numerators<short>::end(local_78);
    if (prVar5 == prVar4) break;
    bVar1 = *(byte *)(in_RSI + 1) & 0x1f;
    uVar2 = (ushort)((int)(char)*(byte *)(in_RSI + 1) >> 7);
    sVar3 = (short)((uint)((int)*(short *)&local_78->_pData * (int)*in_RSI) >> 0x10) +
            *(short *)&local_78->_pData;
    local_6a = local_6a +
               (((ushort)((int)(short)(sVar3 + (sVar3 >> 0xf &
                                               (short)(1 << bVar1) - (ushort)(*in_RSI == 0))) >>
                         bVar1) ^ uVar2) - uVar2);
    local_78 = (random_numerators<short> *)((long)&local_78->_pData + 2);
  }
  return (ulong)local_6a;
}

Assistant:

NOINLINE uint64_t sum_quotients(const random_numerators<IntT> &vals, const Divisor &div) {
    // Need to use unsigned to avoid signed integer overlow.
    typedef typename std::make_unsigned<IntT>::type UIntT;
    UIntT sum = 0;
    for (auto iter = vals.begin(); iter != vals.end(); ++iter) {
        sum += (UIntT)(*iter / div);
    }
    return (uint64_t)sum;
}